

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O0

void Bfree(Bigint *v)

{
  Bigint *v_local;
  
  if (v != (Bigint *)0x0) {
    if (v->k < 8) {
      v->next = TI0.Freelist[v->k];
      TI0.Freelist[v->k] = v;
    }
    else {
      free(v);
    }
  }
  return;
}

Assistant:

static void
Bfree(Bigint *v MTd)
{
#ifdef MULTIPLE_THREADS
	ThInfo *TI;
#endif
	if (v) {
		if (v->k > Kmax)
			FREE((void*)v);
		else {
#ifdef MULTIPLE_THREADS
			if (!(TI = *PTI))
				*PTI = TI = get_TI();
			if (TI == &TI0)
				ACQUIRE_DTOA_LOCK(0);
#endif
			v->next = freelist[v->k];
			freelist[v->k] = v;
#ifdef MULTIPLE_THREADS
			if (TI == &TI0)
				FREE_DTOA_LOCK(0);
#endif
			}
		}
	}